

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O3

void __thiscall
TApp_IniNotRequiredPassedNotFound_Test::TestBody(TApp_IniNotRequiredPassedNotFound_Test *this)

{
  bool bVar1;
  long lVar2;
  string noini;
  AssertHelper local_f0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  string local_88;
  string local_68;
  string local_48;
  
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"TestIniNotExist.ini","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"--config","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  CLI::App::set_config(&(this->super_TApp).app,&local_48,&local_68,&local_88,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_e8[0].ptr_ = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"--config","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char*>((string *)local_c8,local_a8,local_a8 + local_a0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_e8,&local_a8);
  lVar2 = 0;
  do {
    if (local_b8 + lVar2 != *(undefined1 **)((long)local_c8 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_c8 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_e8);
  testing::internal::AssertHelper::AssertHelper
            (&local_f0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
             ,0xfb,
             "Expected: run() throws an exception of type CLI::FileError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_e8);
  testing::internal::AssertHelper::~AssertHelper(&local_f0);
  if (local_e8[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_e8[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_e8[0].ptr_ + 8))();
    }
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  return;
}

Assistant:

TEST_F(TApp, IniNotRequiredPassedNotFound) {

    std::string noini = "TestIniNotExist.ini";
    app.set_config("--config", "", "", false);

    args = {"--config", noini};
    EXPECT_THROW(run(), CLI::FileError);
}